

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlog.cxx
# Opt level: O1

void zpsoe::zlog::_print_log(LogLevel_t level,char *file,int line,char *fmt,...)

{
  FILE *__stream;
  char in_AL;
  undefined8 *puVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  FILE *log_file_;
  va_list ap_;
  FILE *local_110;
  undefined1 **local_108;
  FILE **local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((level != LOG_OFF) && (G_LogConfig <= (int)level)) {
    local_110 = (FILE *)0x0;
    local_c8 = in_R8;
    local_c0 = in_R9;
    if (DAT_0010a4f4 == 0) {
      open_log_file((FILE **)&local_110);
    }
    else {
      if (DAT_0010a4f4 == 2) {
        puVar1 = (undefined8 *)&stderr;
      }
      else {
        puVar1 = (undefined8 *)&stdout;
      }
      local_110 = (FILE *)*puVar1;
    }
    if (_print_log(zpsoe::zlog::LogLevel_t,char_const*,int,char_const*,...)::pid_ == '\0') {
      _print_log();
    }
    __stream = local_110;
    get_current_date_abi_cxx11_();
    fprintf(__stream,"[%s] [%d] ",local_108,(ulong)(uint)_print_log::pid_);
    if (local_108 != local_f8) {
      operator_delete(local_108,(ulong)(local_f8[0] + 1));
    }
    if ((int)level < 2) {
      fprintf(__stream,"%s:%d ",file,(ulong)(uint)line);
    }
    local_f8[0] = local_e8;
    local_100 = &log_file_;
    local_108 = (undefined1 **)0x3000000020;
    vfprintf(__stream,fmt,&local_108);
    fprintf(__stream,OS_LINE_FEED_abi_cxx11_._M_dataplus._M_p);
    fflush(__stream);
    if (DAT_0010a4f4 == 0) {
      fclose(__stream);
    }
  }
  return;
}

Assistant:

ZPSOE_SHARED_LIB_API void _print_log(
    LogLevel_t level, const char *file, int line, const char *fmt, ...) {
  // 关闭日志
  if (level == LOG_OFF) return;

  // 关闭比用户设置更加详细的日志
  if (level < G_LogConfig.level) return;

  FILE *log_file_ = NULL;

  switch (G_LogConfig.output_to) {
    case LOGOUTPUTSTREAM_STDOUT:
      log_file_ = stdout;
      break;
    case LOGOUTPUTSTREAM_STDERR:
      log_file_ = stderr;
      break;
    case LOGOUTPUTSTREAM_FILE:
      open_log_file(&log_file_);
      break;
    default:
      log_file_ = stdout;
      break;
  }

#ifdef PLATFORM_WIN32
    static int pid_ = _getpid();
#else
    static int pid_ = getpid();
#endif

  fprintf(log_file_, "[%s] [%d] ", get_current_date().c_str(), pid_);

  if (level <= LOG_DEBUG)
    fprintf(log_file_, "%s:%d ", file, line);

  va_list ap_;
  va_start(ap_, fmt);
  vfprintf(log_file_, fmt, ap_);
  va_end(ap_);

  fprintf(log_file_, OS_LINE_FEED.c_str());
  fflush(log_file_);

  if (G_LogConfig.output_to == LOGOUTPUTSTREAM_FILE)
    fclose(log_file_);
}